

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

cmd_ln_t * cmd_ln_parse_file_r(cmd_ln_t *inout_cmdln,arg_t *defn,char *filename,int32 strict)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  char **argv;
  long lVar4;
  char **ppcVar5;
  cmd_ln_t *pcVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  char separator [5];
  uint local_7c;
  char *local_78;
  undefined4 local_5c;
  undefined1 local_58;
  int local_54;
  ulong local_50;
  long local_48;
  int32 local_3c;
  arg_t *local_38;
  
  local_58 = 0;
  local_5c = 0xa0d0920;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x30a,"Cannot open configuration file %s for reading\n",filename);
    return (cmd_ln_t *)0x0;
  }
  iVar1 = fgetc(__stream);
  if (iVar1 != -1) {
    do {
      pcVar3 = strchr((char *)&local_5c,iVar1);
      if (pcVar3 == (char *)0x0) {
        local_3c = strict;
        local_38 = defn;
        argv = (char **)__ckd_calloc__(0x1e,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                       ,0x31c);
        local_78 = (char *)__ckd_calloc__(0x201,1,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                          ,0x31e);
        local_50 = 0x200;
        local_54 = 0x1e;
        local_7c = 0;
        iVar7 = 0;
        goto LAB_0010a88b;
      }
      iVar1 = fgetc(__stream);
    } while (iVar1 != -1);
  }
  fclose(__stream);
  return (cmd_ln_t *)0x0;
LAB_0010a88b:
  local_48 = 0;
  do {
    if ((int)local_48 == 0 && (local_7c & 1) == 0) {
LAB_0010a8ac:
      if (iVar1 == 0x23) {
        do {
          iVar1 = fgetc(__stream);
          if (iVar1 == 10) break;
        } while (iVar1 != -1);
        iVar2 = fgetc(__stream);
        iVar1 = -1;
        if (iVar2 != -1) {
          do {
            iVar1 = iVar2;
            pcVar3 = strchr((char *)&local_5c,iVar1);
            if (pcVar3 == (char *)0x0) goto LAB_0010a8ac;
            iVar2 = fgetc(__stream);
          } while (iVar2 != -1);
          iVar1 = -1;
        }
        goto LAB_0010a8ac;
      }
      iVar2 = (int)local_50;
      if (iVar1 == -1) {
        bVar9 = true;
        goto LAB_0010aabd;
      }
    }
    else {
      iVar2 = (int)local_50;
    }
    if ((iVar1 == 0x22) || (iVar1 == 0x27)) {
      if (iVar7 == iVar1) {
        iVar7 = 0;
      }
      else {
        bVar9 = iVar7 != 0;
        iVar7 = iVar1;
        if (bVar9) {
          bVar9 = false;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x335,"Nesting quotations is not supported!\n");
          goto LAB_0010aabd;
        }
      }
    }
    else {
      if (iVar1 == -1) break;
      if (iVar7 == 0) {
        pcVar3 = strchr((char *)&local_5c,iVar1);
        iVar2 = (int)local_50;
        if (pcVar3 != (char *)0x0) break;
      }
      if (iVar2 <= (int)local_48) {
        pcVar3 = (char *)__ckd_realloc__(local_78,(long)(iVar2 * 2 + 1),
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                         ,0x35f);
        if (pcVar3 == (char *)0x0) {
          bVar9 = false;
          goto LAB_0010aabd;
        }
        local_50 = (ulong)(uint)(iVar2 * 2);
        local_78 = pcVar3;
      }
      lVar4 = (long)(int)local_48;
      local_48 = lVar4 + 1;
      local_78[lVar4] = (char)iVar1;
      local_78[lVar4 + 1] = '\0';
    }
    iVar1 = fgetc(__stream);
  } while( true );
  ppcVar5 = argv;
  if (local_54 <= (int)local_7c) {
    local_54 = local_54 * 2;
    ppcVar5 = (char **)__ckd_realloc__(argv,(long)local_54 << 3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                       ,0x341);
    if (ppcVar5 == (char **)0x0) {
      bVar9 = false;
LAB_0010aabd:
      fclose(__stream);
      ckd_free(local_78);
      if (!bVar9) {
        if (0 < (int)local_7c) {
          uVar8 = 0;
          do {
            ckd_free(argv[uVar8]);
            uVar8 = uVar8 + 1;
          } while (local_7c != uVar8);
        }
        ckd_free(argv);
        return (cmd_ln_t *)0x0;
      }
      pcVar6 = parse_options(inout_cmdln,local_38,local_7c,argv,local_3c);
      return pcVar6;
    }
  }
  argv = ppcVar5;
  pcVar3 = __ckd_salloc__(local_78,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x34a);
  argv[local_7c] = pcVar3;
  *local_78 = '\0';
  if (iVar7 != 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x350,"Unclosed quotation, having EOF close it...\n");
  }
  local_7c = local_7c + 1;
  bVar9 = true;
  while( true ) {
    if (iVar1 == -1) goto LAB_0010aabd;
    pcVar3 = strchr((char *)&local_5c,iVar1);
    if (pcVar3 == (char *)0x0) break;
    iVar1 = fgetc(__stream);
  }
  goto LAB_0010a88b;
}

Assistant:

cmd_ln_t *
cmd_ln_parse_file_r(cmd_ln_t *inout_cmdln, const arg_t * defn, const char *filename, int32 strict)
{
    FILE *file;
    int argc;
    int argv_size;
    char *str;
    int arg_max_length = 512;
    int len = 0;
    int quoting, ch;
    char **f_argv;
    int rv = 0;
    const char separator[] = " \t\r\n";

    if ((file = fopen(filename, "r")) == NULL) {
        E_ERROR("Cannot open configuration file %s for reading\n",
                filename);
        return NULL;
    }

    ch = fgetc(file);
    /* Skip to the next interesting character */
    for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

    if (ch == EOF) {
        fclose(file);
        return NULL;
    }

    /*
     * Initialize default argv, argc, and argv_size.
     */
    argv_size = 30;
    argc = 0;
    f_argv = (char **)ckd_calloc(argv_size, sizeof(char *));
    /* Silently make room for \0 */
    str = (char* )ckd_calloc(arg_max_length + 1, sizeof(char));
    quoting = 0;

    do {
        /* Handle arguments that are commented out */
        if (len == 0 && argc % 2 == 0) {
            while (ch == '#') {
                /* Skip everything until newline */
                for (ch = fgetc(file); ch != EOF && ch != '\n'; ch = fgetc(file)) ;
                /* Skip to the next interesting character */
                for (ch = fgetc(file); ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;
            }

            /* Check if we are at the last line (without anything interesting in it) */
            if (ch == EOF)
                break;
        }

        /* Handle quoted arguments */
        if (ch == '"' || ch == '\'') {
            if (quoting == ch) /* End a quoted section with the same type */
                quoting = 0;
            else if (quoting) {
                E_ERROR("Nesting quotations is not supported!\n");
                rv = 1;
                break;
            }
            else
                quoting = ch; /* Start a quoted section */
        }
        else if (ch == EOF || (!quoting && strchr(separator, ch))) {
            /* Reallocate argv so it is big enough to contain all the arguments */
            if (argc >= argv_size) {
                char **tmp_argv;
                if (!(tmp_argv =
                       (char **)ckd_realloc(f_argv, argv_size * 2 * sizeof(char *)))) {
                    rv = 1;
                    break;
                }
                f_argv = tmp_argv;
                argv_size *= 2;
            }

            /* Add the string to the list of arguments */
            f_argv[argc] = ckd_salloc(str);
            len = 0;
            str[0] = '\0';
            argc++;

            if (quoting)
                E_WARN("Unclosed quotation, having EOF close it...\n");

            /* Skip to the next interesting character */
            for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

            if (ch == EOF)
                break;

            /* We already have the next character */
            continue;
        }
        else {
            if (len >= arg_max_length) {
                /* Make room for more chars (including the \0 !) */
                char *tmp_str = str;
                if ((tmp_str = (char *)ckd_realloc(str, (1 + arg_max_length * 2) * sizeof(char))) == NULL) {
                    rv = 1;
                    break;
                }
                str = tmp_str;
                arg_max_length *= 2;
            }
            /* Add the char to the argument string */
            str[len++] = ch;
            /* Always null terminate */
            str[len] = '\0';
        }

        ch = fgetc(file);
    } while (1);

    fclose(file);

    ckd_free(str);

    if (rv) {
        for (ch = 0; ch < argc; ++ch)
            ckd_free(f_argv[ch]);
        ckd_free(f_argv);
        return NULL;
    }

    return parse_options(inout_cmdln, defn, argc, f_argv, strict);
}